

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-getsockname.c
# Opt level: O2

void pipe_client_connect_cb(uv_connect_t *req,int status)

{
  size_t sVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  undefined8 uVar7;
  int64_t eval_b_1;
  int64_t eval_b;
  undefined7 uStack_440;
  undefined4 uStack_439;
  size_t len;
  int64_t eval_b_3;
  char buf [1024];
  
  if (req != &connect_req) {
    pcVar6 = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
    pcVar4 = "req";
    uVar7 = 0x36;
    pcVar3 = "==";
    pcVar5 = "&connect_req";
    eval_b_1 = (int64_t)&connect_req;
    goto LAB_001624e8;
  }
  req = (uv_connect_t *)(long)status;
  eval_b = 0;
  buf._0_8_ = req;
  if (req == (uv_connect_t *)0x0) {
    len = 0x400;
    iVar2 = uv_pipe_getpeername(&pipe_client,buf);
    sVar1 = len;
    eval_b = (int64_t)iVar2;
    if (eval_b == 0) {
      if (buf[0] == '\0') {
        eval_b._0_1_ = '\0';
        eval_b._1_1_ = '/';
        eval_b._2_1_ = 't';
        eval_b._3_1_ = 'm';
        eval_b._4_1_ = 'p';
        eval_b._5_1_ = '/';
        eval_b._6_1_ = 'u';
        eval_b._7_1_ = 'v';
        uStack_440 = 0x732d747365742d;
        uStack_439 = 0x6b636f;
        eval_b_3 = 0x12;
        if (len == 0x12) {
          pcVar6 = (char *)&eval_b;
          iVar2 = bcmp(buf,pcVar6,0x12);
          if (iVar2 == 0) goto LAB_00162360;
          pcVar4 = "expected";
          uVar7 = 0x40;
          goto LAB_00162563;
        }
        pcVar5 = "sizeof(expected) - 1";
        pcVar4 = "len";
        uVar7 = 0x3f;
        eval_b_1 = 0x12;
        pcVar3 = "==";
        req = (uv_connect_t *)len;
        goto LAB_001624e6;
      }
      eval_b = 0;
      if (buf[len - 1] != '\0') {
        pcVar6 = "/tmp/uv-test-sock";
        iVar2 = bcmp(buf,"/tmp/uv-test-sock",len);
        if (iVar2 == 0) {
LAB_00162360:
          len = 0x400;
          iVar2 = uv_pipe_getsockname(&pipe_client,buf);
          if ((iVar2 == 0) && (len == 0)) {
            pipe_client_connect_cb_called = pipe_client_connect_cb_called + 1;
            uv_close(&pipe_client,pipe_close_cb);
            uv_close(&pipe_server,pipe_close_cb);
            return;
          }
          fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-getsockname.c"
                  ,0x48,"r == 0 && len == 0");
          abort();
        }
        pcVar4 = "\"/tmp/uv-test-sock\"";
        uVar7 = 0x43;
LAB_00162563:
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%.*s %s %.*s)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-getsockname.c"
                ,uVar7,"buf","==",pcVar4,sVar1,buf,"==",sVar1,pcVar6);
        abort();
      }
      pcVar3 = "!=";
      pcVar5 = "buf[len - 1]";
      pcVar4 = "0";
      uVar7 = 0x42;
    }
    else {
      pcVar3 = "==";
      pcVar5 = "0";
      pcVar4 = "r";
      uVar7 = 0x3b;
    }
    eval_b_1 = 0;
    req = (uv_connect_t *)eval_b;
  }
  else {
    pcVar5 = "0";
    pcVar4 = "status";
    uVar7 = 0x37;
    eval_b_1 = 0;
    pcVar3 = "==";
  }
LAB_001624e6:
  pcVar6 = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
LAB_001624e8:
  fprintf(_stderr,pcVar6,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-getsockname.c"
          ,uVar7,pcVar4,pcVar3,pcVar5,req,pcVar3,eval_b_1);
  abort();
}

Assistant:

static void pipe_client_connect_cb(uv_connect_t* req, int status) {
  char buf[1024];
  size_t len;
  int r;

  ASSERT_PTR_EQ(req, &connect_req);
  ASSERT_OK(status);

  len = sizeof buf;
  r = uv_pipe_getpeername(&pipe_client, buf, &len);
  ASSERT_OK(r);

  if (*buf == '\0') {  /* Linux abstract socket. */
    const char expected[] = "\0" TEST_PIPENAME;
    ASSERT_EQ(len, sizeof(expected) - 1);
    ASSERT_MEM_EQ(buf, expected, len);
  } else {
    ASSERT_NE(0, buf[len - 1]);
    ASSERT_MEM_EQ(buf, TEST_PIPENAME, len);
  }

  len = sizeof buf;
  r = uv_pipe_getsockname(&pipe_client, buf, &len);
  ASSERT(r == 0 && len == 0);

  pipe_client_connect_cb_called++;

  uv_close((uv_handle_t*) &pipe_client, pipe_close_cb);
  uv_close((uv_handle_t*) &pipe_server, pipe_close_cb);
}